

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O2

int Fraig_NodeVecCompareNumbers(Fraig_Node_t **pp1,Fraig_Node_t **pp2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((ulong)*pp2 & 0xfffffffffffffffe) <= *(int *)((ulong)*pp1 & 0xfffffffffffffffe)) {
    uVar1 = (uint)(*(int *)((ulong)*pp2 & 0xfffffffffffffffe) <
                  *(int *)((ulong)*pp1 & 0xfffffffffffffffe));
  }
  return uVar1;
}

Assistant:

int Fraig_NodeVecCompareNumbers( Fraig_Node_t ** pp1, Fraig_Node_t ** pp2 )
{
    int Num1 = Fraig_Regular(*pp1)->Num;
    int Num2 = Fraig_Regular(*pp2)->Num;
    if ( Num1 < Num2 )
        return -1;
    if ( Num1 > Num2 )
        return 1;
    return 0; 
}